

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall adios2::core::Group::Group(Group *this,Group *G)

{
  string *in_RSI;
  string *in_RDI;
  shared_ptr<adios2::core::Group::TreeMap> *in_stack_ffffffffffffffa8;
  string *this_00;
  allocator local_11;
  string *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI,in_RSI);
  in_RDI[0x20] = local_10[0x20];
  std::shared_ptr<adios2::core::Group::TreeMap>::shared_ptr
            ((shared_ptr<adios2::core::Group::TreeMap> *)this_00,in_stack_ffffffffffffffa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x38,"_ADIOS_ROOT_",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::shared_ptr<adios2::core::Group>::shared_ptr((shared_ptr<adios2::core::Group> *)0x96c9b9);
  *(undefined8 *)(this_00 + 0x68) = *(undefined8 *)(local_10 + 0x68);
  std::shared_ptr<adios2::core::Group::TreeMap>::operator=
            ((shared_ptr<adios2::core::Group::TreeMap> *)this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

Group::Group(const Group &G)
: currentPath(G.currentPath), groupDelimiter(G.groupDelimiter), m_IO(G.m_IO)
{
    mapPtr = G.mapPtr;
}